

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count_suite.cpp
# Opt level: O0

void count_boolean(void)

{
  undefined4 local_d8;
  bool local_d1;
  iterator local_d0;
  iterator local_b8;
  difference_type local_a0 [2];
  undefined4 local_90;
  bool local_89;
  iterator local_88;
  iterator local_60;
  difference_type local_48 [2];
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)local_38,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_60,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_88,(basic_variable<std::allocator<char>_> *)local_38);
  local_89 = false;
  local_48[0] = std::count<trial::dynamic::basic_variable<std::allocator<char>>::iterator,bool>
                          (&local_60,&local_88,&local_89);
  local_90 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count(data.begin(), data.end(), false)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/count_suite.cpp"
             ,0x1e,"void count_boolean()",local_48,&local_90);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_88);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_60);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_b8,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_d0,(basic_variable<std::allocator<char>_> *)local_38);
  local_d1 = true;
  local_a0[0] = std::count<trial::dynamic::basic_variable<std::allocator<char>>::iterator,bool>
                          (&local_b8,&local_d0,&local_d1);
  local_d8 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count(data.begin(), data.end(), true)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/count_suite.cpp"
             ,0x1f,"void count_boolean()",local_a0,&local_d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void count_boolean()
{
    variable data(true);
    TRIAL_PROTOCOL_TEST_EQUAL(std::count(data.begin(), data.end(), false), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(std::count(data.begin(), data.end(), true), 1);
}